

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  byte *pbVar1;
  ushort uVar2;
  undefined8 *puVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  int iVar7;
  u32 uVar8;
  SrcList *pSVar9;
  char *pcVar10;
  Select *pSVar11;
  ExprList *pEVar12;
  Expr *pEVar13;
  long lVar14;
  long lVar15;
  
  if (p != (SrcList *)0x0) {
    iVar7 = 0x50;
    if (0 < p->nSrc) {
      iVar7 = p->nSrc * 0x48 + 8;
    }
    pSVar9 = (SrcList *)sqlite3DbMallocRawNN(db,(long)iVar7);
    if (pSVar9 != (SrcList *)0x0) {
      uVar8 = p->nSrc;
      pSVar9->nAlloc = uVar8;
      pSVar9->nSrc = uVar8;
      lVar15 = 0x48;
      lVar14 = 0;
      do {
        if ((int)uVar8 <= lVar14) {
          return pSVar9;
        }
        *(undefined4 *)((long)pSVar9->a + lVar15 + -0x30) =
             *(undefined4 *)((long)p->a + lVar15 + -0x30);
        if ((*(byte *)((long)p->a + lVar15 + -0x2f) & 4) == 0) {
          pcVar10 = *(char **)((long)p->a + lVar15 + -8);
          if ((*(byte *)((long)p->a + lVar15 + -0x2d) & 1) == 0) {
            pcVar10 = sqlite3DbStrDup(db,pcVar10);
          }
        }
        else {
          pcVar10 = (char *)sqlite3DbMallocRaw(db,0x18);
          if (pcVar10 != (char *)0x0) {
            puVar3 = *(undefined8 **)((long)p->a + lVar15 + -8);
            uVar6 = puVar3[1];
            *(undefined8 *)pcVar10 = *puVar3;
            *(undefined8 *)(pcVar10 + 8) = uVar6;
            *(undefined8 *)(pcVar10 + 0x10) = puVar3[2];
            pSVar11 = sqlite3SelectDup(db,*(Select **)pcVar10,flags);
            *(Select **)pcVar10 = pSVar11;
            if (pSVar11 != (Select *)0x0) goto LAB_00176e68;
            sqlite3DbFreeNN(db,pcVar10);
          }
          pbVar1 = (byte *)((long)pSVar9->a + lVar15 + -0x2f);
          *pbVar1 = *pbVar1 & 0xfb;
          pcVar10 = (char *)0x0;
        }
LAB_00176e68:
        *(char **)((long)pSVar9->a + lVar15 + -8) = pcVar10;
        pcVar10 = sqlite3DbStrDup(db,*(char **)((long)(p->a + -1) + lVar15));
        *(char **)((long)(pSVar9->a + -1) + lVar15) = pcVar10;
        pcVar10 = sqlite3DbStrDup(db,*(char **)((long)p->a + lVar15 + -0x40));
        *(char **)((long)pSVar9->a + lVar15 + -0x40) = pcVar10;
        *(undefined4 *)((long)pSVar9->a + lVar15 + -0x2c) =
             *(undefined4 *)((long)p->a + lVar15 + -0x2c);
        uVar2 = *(ushort *)((long)pSVar9->a + lVar15 + -0x2f);
        if ((uVar2 & 2) == 0) {
          if ((uVar2 & 8) != 0) {
            pEVar12 = sqlite3ExprListDup(db,*(ExprList **)((long)p->a + lVar15 + -0x20),flags);
            goto LAB_00176ed4;
          }
          *(undefined4 *)((long)pSVar9->a + lVar15 + -0x20) =
               *(undefined4 *)((long)p->a + lVar15 + -0x20);
        }
        else {
          pEVar12 = (ExprList *)sqlite3DbStrDup(db,*(char **)((long)p->a + lVar15 + -0x20));
LAB_00176ed4:
          *(ExprList **)((long)pSVar9->a + lVar15 + -0x20) = pEVar12;
        }
        piVar4 = *(int **)((long)p->a + lVar15 + -0x18);
        *(int **)((long)pSVar9->a + lVar15 + -0x18) = piVar4;
        if ((*(byte *)((long)pSVar9->a + lVar15 + -0x2e) & 2) != 0) {
          *piVar4 = *piVar4 + 1;
        }
        lVar5 = *(long *)((long)p->a + lVar15 + -0x38);
        *(long *)((long)pSVar9->a + lVar15 + -0x38) = lVar5;
        if (lVar5 != 0) {
          *(int *)(lVar5 + 0x2c) = *(int *)(lVar5 + 0x2c) + 1;
        }
        pEVar13 = *(Expr **)((long)p->a + lVar15 + -0x10);
        if ((*(byte *)((long)p->a + lVar15 + -0x2e) & 8) == 0) {
          pEVar13 = sqlite3ExprDup(db,pEVar13,flags);
        }
        else {
          pEVar13 = (Expr *)sqlite3IdListDup(db,(IdList *)pEVar13);
        }
        *(Expr **)((long)pSVar9->a + lVar15 + -0x10) = pEVar13;
        *(undefined8 *)((long)pSVar9->a + lVar15 + -0x28) =
             *(undefined8 *)((long)p->a + lVar15 + -0x28);
        lVar14 = lVar14 + 1;
        uVar8 = p->nSrc;
        lVar15 = lVar15 + 0x48;
      } while( true );
    }
  }
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, const SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    SrcItem *pNewItem = &pNew->a[i];
    const SrcItem *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->fg = pOldItem->fg;
    if( pOldItem->fg.isSubquery ){
      Subquery *pNewSubq = sqlite3DbMallocRaw(db, sizeof(Subquery));
      if( pNewSubq==0 ){
        assert( db->mallocFailed );
        pNewItem->fg.isSubquery = 0;
      }else{
        memcpy(pNewSubq, pOldItem->u4.pSubq, sizeof(*pNewSubq));
        pNewSubq->pSelect = sqlite3SelectDup(db, pNewSubq->pSelect, flags);
        if( pNewSubq->pSelect==0 ){
          sqlite3DbFree(db, pNewSubq);
          pNewSubq = 0;
          pNewItem->fg.isSubquery = 0;
        }
      }
      pNewItem->u4.pSubq = pNewSubq;
    }else if( pOldItem->fg.fixedSchema ){
      pNewItem->u4.pSchema = pOldItem->u4.pSchema;
    }else{
      pNewItem->u4.zDatabase = sqlite3DbStrDup(db, pOldItem->u4.zDatabase);
    }
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->iCursor = pOldItem->iCursor;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }else if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg =
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }else{
      pNewItem->u1.nRow = pOldItem->u1.nRow;
    }
    pNewItem->u2 = pOldItem->u2;
    if( pNewItem->fg.isCte ){
      pNewItem->u2.pCteUse->nUse++;
    }
    pTab = pNewItem->pSTab = pOldItem->pSTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    if( pOldItem->fg.isUsing ){
      assert( pNewItem->fg.isUsing );
      pNewItem->u3.pUsing = sqlite3IdListDup(db, pOldItem->u3.pUsing);
    }else{
      pNewItem->u3.pOn = sqlite3ExprDup(db, pOldItem->u3.pOn, flags);
    }
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}